

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImVector<ImFontConfig> *this_00;
  ImVector<ImFont_*> *this_01;
  value_type *pvVar1;
  value_type *ppIVar2;
  int i;
  int iVar3;
  
  this_00 = &this->ConfigData;
  for (iVar3 = 0; iVar3 < this_00->Size; iVar3 = iVar3 + 1) {
    pvVar1 = ImVector<ImFontConfig>::operator[](this_00,iVar3);
    if (pvVar1->FontData != (void *)0x0) {
      pvVar1 = ImVector<ImFontConfig>::operator[](this_00,iVar3);
      if (pvVar1->FontDataOwnedByAtlas == true) {
        pvVar1 = ImVector<ImFontConfig>::operator[](this_00,iVar3);
        ImGui::MemFree(pvVar1->FontData);
        pvVar1 = ImVector<ImFontConfig>::operator[](this_00,iVar3);
        pvVar1->FontData = (void *)0x0;
      }
    }
  }
  this_01 = &this->Fonts;
  for (iVar3 = 0; iVar3 < this_01->Size; iVar3 = iVar3 + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[](this_01,iVar3);
    if ((this->ConfigData).Data <= (*ppIVar2)->ConfigData) {
      ppIVar2 = ImVector<ImFont_*>::operator[](this_01,iVar3);
      if ((*ppIVar2)->ConfigData < (this->ConfigData).Data + (this->ConfigData).Size) {
        ppIVar2 = ImVector<ImFont_*>::operator[](this_01,iVar3);
        (*ppIVar2)->ConfigData = (ImFontConfig *)0x0;
        ppIVar2 = ImVector<ImFont_*>::operator[](this_01,iVar3);
        (*ppIVar2)->ConfigDataCount = 0;
      }
    }
  }
  ImVector<ImFontConfig>::clear(this_00);
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            ImGui::MemFree(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
}